

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

int __thiscall lzham::lzcompressor::init(lzcompressor *this,EVP_PKEY_CTX *ctx)

{
  compression_level cVar1;
  task_pool *ptVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  void *pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  char cVar10;
  int iVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  
  clear(this);
  if (*(int *)(ctx + 0x10) - 0x1eU < 0xfffffff1) {
    return 0;
  }
  if (5 < *(uint *)(ctx + 0xc)) {
    return 0;
  }
  uVar3 = *(undefined8 *)(ctx + 8);
  uVar4 = *(undefined8 *)(ctx + 0x10);
  uVar5 = *(undefined8 *)(ctx + 0x18);
  pvVar6 = *(void **)(ctx + 0x20);
  uVar7 = *(undefined8 *)(ctx + 0x28);
  uVar8 = *(undefined8 *)(ctx + 0x2c);
  uVar9 = *(undefined8 *)(ctx + 0x34);
  (this->m_params).m_pTask_pool = *(task_pool **)ctx;
  (this->m_params).m_max_helper_threads = (int)uVar3;
  (this->m_params).m_compression_level = (int)((ulong)uVar3 >> 0x20);
  (this->m_params).m_table_max_update_interval = (int)uVar8;
  (this->m_params).m_table_update_interval_slow_rate = (int)((ulong)uVar8 >> 0x20);
  (this->m_params).m_extreme_parsing_max_best_arrivals = (int)uVar9;
  (this->m_params).m_fast_bytes_override = (int)((ulong)uVar9 >> 0x20);
  (this->m_params).m_pSeed_bytes = pvVar6;
  (this->m_params).m_num_seed_bytes = (int)uVar7;
  (this->m_params).m_table_max_update_interval = (int)((ulong)uVar7 >> 0x20);
  (this->m_params).m_dict_size_log2 = (int)uVar4;
  (this->m_params).m_block_size = (int)((ulong)uVar4 >> 0x20);
  *(undefined8 *)&(this->m_params).m_lzham_compress_flags = uVar5;
  ptVar2 = (this->m_params).m_pTask_pool;
  if ((ptVar2 == (task_pool *)0x0) || (ptVar2->m_num_threads == 0)) {
    bVar18 = false;
  }
  else {
    bVar18 = (this->m_params).m_max_helper_threads != 0;
  }
  this->m_use_task_pool = bVar18;
  cVar1 = (this->m_params).m_compression_level;
  uVar15 = (this->m_params).m_lzham_compress_flags;
  bVar12 = (bool)(cVar1 == cCompressionLevelUber & (byte)uVar15 >> 1);
  this->m_use_extreme_parsing = bVar12;
  if (bVar18 == false) {
    (this->m_params).m_max_helper_threads = 0;
  }
  uVar16 = *(uint *)(ctx + 0xc);
  (this->m_settings).m_match_accel_max_probes =
       *(uint *)(s_level_settings + (ulong)uVar16 * 0xc + 8);
  uVar3 = *(undefined8 *)(s_level_settings + (ulong)uVar16 * 0xc);
  uVar13 = 0x60;
  if (bVar12 == false) {
    uVar13 = (uint)uVar3;
  }
  (this->m_settings).m_fast_bytes = (int)uVar3;
  (this->m_settings).m_match_accel_max_matches_per_probe = (int)((ulong)uVar3 >> 0x20);
  this->m_fast_bytes = uVar13;
  uVar16 = (this->m_params).m_fast_bytes_override;
  if (uVar16 != 0) {
    uVar14 = 0x102;
    if (uVar16 < 0x102) {
      uVar14 = uVar16;
    }
    uVar16 = 8;
    if (8 < uVar14) {
      uVar16 = uVar14;
    }
    this->m_fast_bytes = uVar16;
  }
  uVar16 = 1 << ((byte)(this->m_params).m_dict_size_log2 & 0x1f);
  if ((*(uint *)(ctx + 0x28) != 0) && (uVar16 < *(uint *)(ctx + 0x28) || *(long *)(ctx + 0x20) == 0)
     ) {
    return 0;
  }
  uVar16 = uVar16 >> 3;
  uVar14 = (this->m_params).m_block_size;
  if (uVar16 < uVar14) {
    (this->m_params).m_block_size = uVar16;
    uVar14 = uVar16;
  }
  this->m_num_parse_threads = 1;
  uVar16 = (this->m_params).m_max_helper_threads;
  if ((uVar15 & 0x40) == 0 && uVar16 != 0) {
    if (uVar14 < 0x4000) {
      uVar15 = 8;
      if (uVar16 + 1 < 8) {
        uVar15 = uVar16 + 1;
      }
    }
    else {
      if (cVar1 == cCompressionLevelFastest || uVar16 < 6) goto code_r0x00107063;
      uVar15 = (uint)bVar12 * 2 + 2;
    }
    this->m_num_parse_threads = uVar15;
  }
code_r0x00107063:
  iVar11 = search_accelerator::init(&this->m_accel,(EVP_PKEY_CTX *)this);
  if ((char)iVar11 == '\0') {
    return 0;
  }
  uVar15 = (uint)this;
  lzham::CLZDecompBase::init_position_slots(uVar15);
  CLZBase::init_slot_tabs(&this->super_CLZBase);
  iVar11 = state::init(&this->m_state,(EVP_PKEY_CTX *)this);
  if ((char)iVar11 != '\0') {
    cVar10 = lzham::elemental_vector::increase_capacity
                       (uVar15 + 0x3938,SUB41((this->m_params).m_block_size,0),1,
                        (_func_void_void_ptr_void_ptr_uint *)0x1,false);
    if (cVar10 == '\0') {
      return 0;
    }
    cVar10 = lzham::elemental_vector::increase_capacity
                       (uVar15 + 0x3950,(bool)((char)(this->m_params).m_block_size * '\x02'),1,
                        (_func_void_void_ptr_void_ptr_uint *)0x1,false);
    if (cVar10 == '\0') {
      return 0;
    }
    lVar17 = 0x43f0;
    do {
      iVar11 = raw_parse_thread_state::init
                         ((raw_parse_thread_state *)
                          ((long)&(this->super_CLZBase).super_CLZDecompBase.m_dict_size_log2 +
                          lVar17),(EVP_PKEY_CTX *)this);
      if ((char)iVar11 == '\0') {
        return 0;
      }
      lVar17 = lVar17 + 0x156800;
    } while (lVar17 != 0xc0ebf0);
    if (((*(int *)(ctx + 0x28) == 0) || (bVar18 = init_seed_bytes(this), bVar18)) &&
       (bVar18 = send_zlib_header(this), bVar18)) {
      this->m_src_size = 0;
      return (int)CONCAT71((int7)((ulong)&this->m_params >> 8),1);
    }
  }
  return 0;
}

Assistant:

bool lzcompressor::init(const init_params& params)
   {
      clear();

      if ((params.m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (params.m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
      {
         LZHAM_LOG_ERROR(7001);
         return false;
      }

      if ((params.m_compression_level < 0) || (params.m_compression_level > cCompressionLevelCount))
      {
         LZHAM_LOG_ERROR(7002);
         return false;
      }

      m_params = params;
      m_use_task_pool = (m_params.m_pTask_pool) && (m_params.m_pTask_pool->get_num_threads() != 0) && (m_params.m_max_helper_threads > 0);

      m_use_extreme_parsing = ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_EXTREME_PARSING) && (m_params.m_compression_level == cCompressionLevelUber));

      if (!m_use_task_pool)
         m_params.m_max_helper_threads = 0;

      m_settings = s_level_settings[params.m_compression_level];

      m_fast_bytes = m_use_extreme_parsing ? LZHAM_EXTREME_PARSING_FAST_BYTES : m_settings.m_fast_bytes;
      if (m_params.m_fast_bytes_override)
      {
         m_fast_bytes = math::clamp<uint>(m_params.m_fast_bytes_override, 8, CLZBase::cMaxMatchLen + 1);
      }

      const uint dict_size = 1U << m_params.m_dict_size_log2;

      if (params.m_num_seed_bytes)
      {
         if (!params.m_pSeed_bytes)
         {
            LZHAM_LOG_ERROR(7003);
            return false;
         }
         if (params.m_num_seed_bytes > dict_size)
         {
            LZHAM_LOG_ERROR(7004);
            return false;
         }
      }

      uint max_block_size = dict_size / 8;
      if (m_params.m_block_size > max_block_size)
      {
         m_params.m_block_size = max_block_size;
      }

      m_num_parse_threads = 1;

#if !LZHAM_FORCE_SINGLE_THREADED_PARSING
      if ((m_params.m_max_helper_threads > 0) && ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_FORCE_SINGLE_THREADED_PARSING) == 0))
      {
         LZHAM_ASSUME(cMaxParseThreads >= 4);

         if (m_params.m_block_size < 16384)
            m_num_parse_threads = LZHAM_MIN(cMaxParseThreads, m_params.m_max_helper_threads + 1);
         else if ((m_params.m_max_helper_threads <= 5) || (m_params.m_compression_level == cCompressionLevelFastest))
            m_num_parse_threads = 1;
         else
            m_num_parse_threads = m_use_extreme_parsing ? 4 : 2;
      }
#endif

      int num_parse_jobs = m_num_parse_threads - 1;
      uint match_accel_helper_threads = LZHAM_MAX(0, (int)m_params.m_max_helper_threads - num_parse_jobs);
      match_accel_helper_threads = LZHAM_MIN(match_accel_helper_threads, cMatchAccelMaxSupportedThreads);

      LZHAM_ASSERT(m_num_parse_threads >= 1);
      LZHAM_ASSERT(m_num_parse_threads <= cMaxParseThreads);

      if (!m_use_task_pool)
      {
         LZHAM_ASSERT(!match_accel_helper_threads && (m_num_parse_threads == 1));
      }
      else
      {
         LZHAM_ASSERT((match_accel_helper_threads + (m_num_parse_threads - 1)) <= m_params.m_max_helper_threads);
      }

      uint accel_flags = 0;
      if (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_DETERMINISTIC_PARSING)
         accel_flags |= search_accelerator::cFlagDeterministic;

      if (m_params.m_compression_level > cCompressionLevelFastest)
      {
         if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_USE_LOW_MEMORY_MATCH_FINDER) == 0)
            accel_flags |= search_accelerator::cFlagHash24;

         accel_flags |= search_accelerator::cFlagLen2Matches;
      }

      if (!m_accel.init(this, params.m_pTask_pool, match_accel_helper_threads, dict_size, m_settings.m_match_accel_max_matches_per_probe, false, m_settings.m_match_accel_max_probes, accel_flags))
      {
         LZHAM_LOG_ERROR(7005);
         return false;
      }

      init_position_slots(params.m_dict_size_log2);
      init_slot_tabs();

      if (!m_state.init(*this, m_params.m_table_max_update_interval, m_params.m_table_update_interval_slow_rate))
      {
         LZHAM_LOG_ERROR(7006);
         return false;
      }

      if (!m_block_buf.try_reserve(m_params.m_block_size))
      {
         LZHAM_LOG_ERROR(7007);
         return false;
      }

      if (!m_comp_buf.try_reserve(m_params.m_block_size*2))
      {
         LZHAM_LOG_ERROR(7008);
         return false;
      }

      for (uint i = 0; i < LZHAM_ARRAY_SIZE(m_parse_thread_state); i++)
      {
         if (!m_parse_thread_state[i].init(*this, m_params))
         {
            LZHAM_LOG_ERROR(7009);
            return false;
         }
      }

      if (params.m_num_seed_bytes)
      {
         if (!init_seed_bytes())
         {
            LZHAM_LOG_ERROR(7010);
            return false;
         }
      }

      if (!send_zlib_header())
      {
         LZHAM_LOG_ERROR(7011);
         return false;
      }

      m_src_size = 0;

      return true;
   }